

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestUpdate(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int p_col,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *p_work,int num,int *nonz)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  pointer pnVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  undefined1 auVar10 [16];
  int *piVar11;
  fpclass_type *pfVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  undefined8 *puVar17;
  uint uVar18;
  uint uVar19;
  fpclass_type *pfVar20;
  cpp_dec_float<50u,int,void> *pcVar21;
  int iVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pCVar24;
  uint uVar25;
  uint *puVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  int *piVar35;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar36;
  uint uVar37;
  cpp_dec_float<50u,int,void> *pcVar38;
  ulong uVar39;
  cpp_dec_float<50U,_int,_void> *pcVar40;
  long lVar41;
  Real RVar42;
  double a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_318;
  cpp_dec_float<50u,int,void> *local_2e0;
  cpp_dec_float<50U,_int,_void> local_2d8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_298;
  uint *local_290;
  int *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  int *local_278;
  int *local_270;
  int *local_268;
  ulong local_260;
  pointer local_258;
  ulong local_250;
  int *local_248;
  pointer local_240;
  int *local_238;
  int *local_230;
  int *local_228;
  int *local_220;
  int *local_218;
  undefined8 uStack_210;
  int *local_208;
  pointer local_200;
  ulong local_1f8;
  undefined8 uStack_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  long local_1b0;
  int *local_1a8;
  int *local_1a0;
  int *local_198;
  int *local_190;
  cpp_dec_float<50U,_int,_void> local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f8 [2];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8 [2];
  undefined8 uStack_c0;
  undefined8 local_b8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_318.fpclass = cpp_dec_float_finite;
  local_318.prec_elem = 10;
  local_318.data._M_elems[0] = 0;
  local_318.data._M_elems[1] = 0;
  local_318.data._M_elems[2] = 0;
  local_318.data._M_elems[3] = 0;
  local_318.data._M_elems[4] = 0;
  local_318.data._M_elems[5] = 0;
  local_318.data._M_elems[6] = 0;
  local_318.data._M_elems[7] = 0;
  local_318.data._M_elems[8] = 0;
  local_318.data._M_elems[9] = 0;
  local_318.exp = 0;
  local_318.neg = false;
  local_190 = (this->l).start;
  piVar16 = (this->u).col.idx;
  local_1a8 = (this->u).col.max;
  local_228 = (this->u).col.len;
  local_220 = (this->u).col.start;
  pcVar38 = (cpp_dec_float<50u,int,void> *)
            (this->u).row.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_278 = (this->u).row.idx;
  local_198 = (this->u).row.max;
  local_268 = (this->u).row.len;
  local_238 = (this->u).row.start;
  local_1a0 = (this->row).orig;
  local_230 = (this->row).perm;
  local_200 = (pointer)(this->col).perm;
  local_208 = (this->col).orig;
  uVar3 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8);
  local_1e8.data._M_elems[8] = (uint)uVar3;
  local_1e8.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)(this->maxabs).m_backend.data._M_elems;
  uVar6 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2);
  uVar7 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4);
  uVar8 = *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6);
  local_1e8.data._M_elems[4] = (uint)uVar7;
  local_1e8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
  local_1e8.data._M_elems[6] = (uint)uVar8;
  local_1e8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
  local_1e8.data._M_elems[0] = (uint)uVar3;
  local_1e8.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
  local_1e8.data._M_elems[2] = (uint)uVar6;
  local_1e8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
  local_1e8.exp = (this->maxabs).m_backend.exp;
  local_1e8.neg = (this->maxabs).m_backend.neg;
  local_1e8.fpclass = (this->maxabs).m_backend.fpclass;
  local_1e8.prec_elem = (this->maxabs).m_backend.prec_elem;
  uVar18 = this->thedim;
  local_260 = (ulong)uVar18;
  lVar29 = (long)p_col;
  iVar14 = local_220[lVar29];
  iVar22 = local_228[lVar29];
  this->nzCnt = this->nzCnt - iVar22;
  iVar22 = iVar14 + iVar22 + -1;
  if (iVar14 <= iVar22) {
    lVar41 = (long)iVar22;
    do {
      iVar22 = piVar16[lVar41];
      lVar32 = (long)local_238[iVar22];
      iVar15 = local_268[iVar22];
      local_268[iVar22] = (int)((long)iVar15 + -1);
      pfVar12 = &(((pointer)((long)pcVar38 + (lVar32 + -1) * 0x38))->m_backend).fpclass;
      piVar13 = local_278 + lVar32;
      do {
        piVar35 = piVar13;
        pfVar20 = pfVar12;
        pfVar12 = pfVar20 + 0xe;
        piVar13 = piVar35 + 1;
      } while (*piVar35 != p_col);
      lVar32 = (long)iVar15 + -1 + lVar32;
      *piVar35 = local_278[lVar32];
      *(undefined8 *)(pfVar20 + 10) =
           *(undefined8 *)
            ((long)(((pointer)((long)pcVar38 + lVar32 * 0x38))->m_backend).data._M_elems + 0x20);
      uVar3 = *(undefined8 *)(((pointer)((long)pcVar38 + lVar32 * 0x38))->m_backend).data._M_elems;
      uVar6 = *(undefined8 *)
               ((long)(((pointer)((long)pcVar38 + lVar32 * 0x38))->m_backend).data._M_elems + 8);
      puVar26 = (uint *)((long)(((pointer)((long)pcVar38 + lVar32 * 0x38))->m_backend).data._M_elems
                        + 0x10);
      uVar7 = *(undefined8 *)(puVar26 + 2);
      *(undefined8 *)(pfVar20 + 6) = *(undefined8 *)puVar26;
      *(undefined8 *)(pfVar20 + 8) = uVar7;
      *(undefined8 *)(pfVar20 + 2) = uVar3;
      *(undefined8 *)(pfVar20 + 4) = uVar6;
      pfVar20[0xc] = (((pointer)((long)pcVar38 + lVar32 * 0x38))->m_backend).exp;
      *(bool *)(pfVar20 + 0xd) = (((pointer)((long)pcVar38 + lVar32 * 0x38))->m_backend).neg;
      *(undefined8 *)(pfVar20 + 0xe) =
           *(undefined8 *)&(((pointer)((long)pcVar38 + lVar32 * 0x38))->m_backend).fpclass;
      bVar5 = iVar14 < lVar41;
      lVar41 = lVar41 + -1;
    } while (bVar5);
  }
  local_298 = this;
  local_290 = (uint *)nonz;
  local_280 = p_work;
  local_1b0 = lVar29;
  if (num == 0) {
    local_270 = (this->u).col.idx;
    local_258 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_248 = (int *)CONCAT44(local_248._4_4_,local_220[lVar29]);
    if ((int)uVar18 < 1) {
      local_288 = (int *)0x0;
    }
    else {
      local_250 = CONCAT44(local_250._4_4_,local_1a8[lVar29] + local_220[lVar29]);
      uVar39 = 0;
      local_240 = (pointer)CONCAT44(local_240._4_4_,uVar18);
      local_288 = (int *)0x0;
      do {
        local_318.data._M_elems[8] = (uint)*(undefined8 *)((long)p_work + 0x20);
        local_318.data._M_elems[9] = (uint)((ulong)*(undefined8 *)((long)p_work + 0x20) >> 0x20);
        local_318.data._M_elems[4] = (uint)*(undefined8 *)((long)p_work + 0x10);
        local_318.data._M_elems[5] = (uint)((ulong)*(undefined8 *)((long)p_work + 0x10) >> 0x20);
        local_318.data._M_elems[6] = (uint)*(undefined8 *)((long)p_work + 0x18);
        local_318.data._M_elems[7] = (uint)((ulong)*(undefined8 *)((long)p_work + 0x18) >> 0x20);
        local_318.data._M_elems[0] = (uint)*(undefined8 *)p_work;
        local_318.data._M_elems[1] = (uint)((ulong)*(undefined8 *)p_work >> 0x20);
        local_318.data._M_elems[2] = (uint)*(undefined8 *)((long)p_work + 8);
        local_318.data._M_elems[3] = (uint)((ulong)*(undefined8 *)((long)p_work + 8) >> 0x20);
        local_318.exp = *(int *)((long)p_work + 0x28);
        local_318.neg = *(bool *)((long)p_work + 0x2c);
        local_318._48_8_ = *(undefined8 *)((long)p_work + 0x30);
        local_2e0 = pcVar38;
        local_1f8 = uVar39;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)p_work,0.0);
        uVar3 = local_318._48_8_;
        bVar5 = local_318.neg;
        iVar14 = local_318.exp;
        local_108 = CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
        uStack_100 = CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
        local_f8[1] = local_318.data._M_elems[5];
        local_f8[0] = local_318.data._M_elems[4];
        uStack_f0 = CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
        local_e8 = CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
        local_218 = (int *)local_318._48_8_;
        uStack_210 = 0;
        RVar42 = Tolerances::epsilonUpdate
                           ((this->_tolerances).
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_a8,RVar42);
        this = local_298;
        pcVar38 = local_2e0;
        uVar6 = local_318._48_8_;
        local_2d8.data._M_elems._32_5_ = SUB85(local_e8,0);
        local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_e8 >> 0x28);
        local_2d8.data._M_elems[4] = local_f8[0];
        local_2d8.data._M_elems[5] = local_f8[1];
        local_2d8.data._M_elems._24_5_ = SUB85(uStack_f0,0);
        local_2d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_f0 >> 0x28);
        local_2d8.data._M_elems._8_8_ = uStack_100;
        local_2d8.data._M_elems._0_8_ = local_108;
        auVar10 = (undefined1  [16])local_2d8.data._M_elems._0_16_;
        local_2d8.exp = iVar14;
        local_2d8.neg = bVar5;
        local_318.fpclass = (fpclass_type)uVar3;
        local_318.prec_elem = SUB84(uVar3,4);
        local_2d8.fpclass = local_318.fpclass;
        local_2d8.prec_elem = local_318.prec_elem;
        if (((cpp_dec_float<50u,int,void>)bVar5 == (cpp_dec_float<50u,int,void>)0x1) &&
           (local_2d8.data._M_elems[0] = (uint)local_108,
           local_2d8.data._M_elems[0] != 0 || (int)local_218 != 0)) {
          local_2d8.neg = false;
        }
        local_318._48_8_ = uVar6;
        local_2d8.data._M_elems._0_16_ = auVar10;
        if ((((int)local_218 != 2) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_2d8,&local_a8), 0 < iVar14)) {
          local_2d8.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
          local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
          local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
          local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
          local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
          local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
          local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
          local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
          local_2d8.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
          local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
          local_2d8.exp = local_318.exp;
          local_2d8.neg = local_318.neg;
          local_2d8.fpclass = local_318.fpclass;
          local_2d8.prec_elem = local_318.prec_elem;
          if (((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) &&
             (local_318.data._M_elems[0] != 0 || local_318.fpclass != 0)) {
            local_2d8.neg = false;
          }
          if ((local_318.fpclass == 2) || (local_1e8.fpclass == cpp_dec_float_NaN)) {
          }
          else {
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_2d8,&local_1e8);
            if (0 < iVar14) {
              local_1e8.neg = local_318.neg;
              if ((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) {
                local_1e8.neg = local_318.fpclass == 0 && local_318.data._M_elems[0] == 0;
              }
              local_1e8.data._M_elems[0] = local_318.data._M_elems[0];
              local_1e8.data._M_elems[9] = local_318.data._M_elems[9];
              local_1e8.data._M_elems[5] = local_318.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_318.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_318.data._M_elems[7];
              local_1e8.data._M_elems[8] = local_318.data._M_elems[8];
              local_1e8.data._M_elems[1] = local_318.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_318.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_318.data._M_elems[3];
              local_1e8.data._M_elems[4] = local_318.data._M_elems[4];
              local_1e8.exp = local_318.exp;
              local_1e8.fpclass = local_318.fpclass;
              local_1e8.prec_elem = local_318.prec_elem;
            }
          }
          lVar29 = local_1b0;
          piVar16 = local_220;
          iVar14 = (int)local_248;
          if ((int)local_250 <= (int)local_248) {
            local_228[local_1b0] = (int)local_248 - local_220[local_1b0];
            forestReMaxCol(this,p_col,(int)local_240);
            local_270 = (this->u).col.idx;
            local_258 = (this->u).col.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_250 = CONCAT44(local_250._4_4_,local_1a8[lVar29] + piVar16[lVar29]);
            iVar14 = piVar16[lVar29] + local_228[lVar29];
          }
          *(ulong *)((long)local_258[iVar14].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
          puVar26 = (uint *)((long)local_258[iVar14].m_backend.data._M_elems + 0x10);
          *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
          *(ulong *)(puVar26 + 2) = CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
          *(ulong *)local_258[iVar14].m_backend.data._M_elems =
               CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
          *(ulong *)((long)local_258[iVar14].m_backend.data._M_elems + 8) =
               CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
          local_258[iVar14].m_backend.exp = local_318.exp;
          local_258[iVar14].m_backend.neg = local_318.neg;
          local_258[iVar14].m_backend.fpclass = local_318.fpclass;
          local_258[iVar14].m_backend.prec_elem = local_318.prec_elem;
          local_270[iVar14] = (int)local_1f8;
          if (local_198[local_1f8] <= local_268[local_1f8]) {
            remaxRow(this,(int)local_1f8,local_268[local_1f8] + 1);
            pcVar38 = (cpp_dec_float<50u,int,void> *)
                      (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_278 = (this->u).row.idx;
          }
          local_248 = (int *)CONCAT44(local_248._4_4_,iVar14 + 1);
          iVar14 = local_238[local_1f8];
          iVar22 = local_268[local_1f8];
          local_268[local_1f8] = iVar22 + 1;
          lVar29 = (long)iVar14 + (long)iVar22;
          *(ulong *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems +
                    0x20) = CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
          puVar26 = (uint *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data.
                                   _M_elems + 0x10);
          *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
          *(ulong *)(puVar26 + 2) = CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
          *(ulong *)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems =
               CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
          *(ulong *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems + 8
                    ) = CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).exp = local_318.exp;
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).neg = local_318.neg;
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).fpclass = local_318.fpclass;
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).prec_elem = local_318.prec_elem;
          local_278[lVar29] = p_col;
          iVar14 = (int)local_288;
          local_288 = (int *)((ulong)local_288 & 0xffffffff);
          if (iVar14 < local_230[local_1f8]) {
            local_288 = (int *)(ulong)(uint)local_230[local_1f8];
          }
        }
        uVar39 = local_1f8 + 1;
        local_240 = (pointer)CONCAT44(local_240._4_4_,(int)local_240 + -1);
        p_work = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)p_work + 0x38);
      } while (local_260 != uVar39);
    }
    iVar14 = local_220[local_1b0];
    local_228[local_1b0] = (int)local_248 - iVar14;
    this->nzCnt = this->nzCnt + ((int)local_248 - iVar14);
    iVar14 = (this->u).col.used;
    if (local_220[local_1b0] + local_1a8[local_1b0] == iVar14) {
      (this->u).col.used = iVar14 - local_1a8[local_1b0];
      iVar14 = local_228[local_1b0];
      local_1a8[local_1b0] = iVar14;
      piVar16 = &(this->u).col.used;
      *piVar16 = *piVar16 + iVar14;
    }
  }
  else {
    local_228[lVar29] = 0;
    if (local_1a8[lVar29] < num) {
      forestReMaxCol(this,p_col,num);
    }
    local_270 = (this->u).col.idx;
    local_258 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_250 = CONCAT44(local_250._4_4_,local_220[lVar29]);
    if (num < 1) {
      local_288 = (int *)0x0;
    }
    else {
      local_248 = (int *)(ulong)(uint)num;
      uVar39 = 0;
      local_288 = (int *)0x0;
      do {
        local_240 = (pointer)CONCAT44(local_240._4_4_,local_290[uVar39]);
        local_218 = (int *)(long)(int)local_290[uVar39];
        uVar3 = *(undefined8 *)(p_work[(long)local_218].m_backend.data._M_elems + 8);
        local_318.data._M_elems[8] = (uint)uVar3;
        local_318.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
        uVar3 = *(undefined8 *)p_work[(long)local_218].m_backend.data._M_elems;
        uVar6 = *(undefined8 *)(p_work[(long)local_218].m_backend.data._M_elems + 2);
        puVar26 = p_work[(long)local_218].m_backend.data._M_elems + 4;
        uVar7 = *(undefined8 *)puVar26;
        uVar8 = *(undefined8 *)(puVar26 + 2);
        local_318.data._M_elems[4] = (uint)uVar7;
        local_318.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
        local_318.data._M_elems[6] = (uint)uVar8;
        local_318.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
        local_318.data._M_elems[0] = (uint)uVar3;
        local_318.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
        local_318.data._M_elems[2] = (uint)uVar6;
        local_318.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
        local_318.exp = p_work[(long)local_218].m_backend.exp;
        local_318.neg = p_work[(long)local_218].m_backend.neg;
        local_318.fpclass = p_work[(long)local_218].m_backend.fpclass;
        local_318.prec_elem = p_work[(long)local_218].m_backend.prec_elem;
        local_2e0 = pcVar38;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)(p_work + (long)local_218),0.0);
        uVar3 = local_318._48_8_;
        bVar5 = local_318.neg;
        iVar14 = local_318.exp;
        local_d8 = CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
        uStack_d0 = CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
        local_c8[1] = local_318.data._M_elems[5];
        local_c8[0] = local_318.data._M_elems[4];
        uStack_c0 = CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
        local_b8 = CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
        local_1f8._0_4_ = local_318.fpclass;
        local_1f8._4_4_ = local_318.prec_elem;
        uStack_1f0 = 0;
        RVar42 = Tolerances::epsilonUpdate
                           ((this->_tolerances).
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,RVar42);
        p_work = local_280;
        this = local_298;
        pcVar38 = local_2e0;
        uVar6 = local_318._48_8_;
        local_2d8.data._M_elems._32_5_ = SUB85(local_b8,0);
        local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_b8 >> 0x28);
        local_2d8.data._M_elems[4] = local_c8[0];
        local_2d8.data._M_elems[5] = local_c8[1];
        local_2d8.data._M_elems._24_5_ = SUB85(uStack_c0,0);
        local_2d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_c0 >> 0x28);
        local_2d8.data._M_elems._8_8_ = uStack_d0;
        local_2d8.data._M_elems._0_8_ = local_d8;
        auVar10 = (undefined1  [16])local_2d8.data._M_elems._0_16_;
        local_2d8.exp = iVar14;
        local_2d8.neg = bVar5;
        local_318.fpclass = (fpclass_type)uVar3;
        local_318.prec_elem = SUB84(uVar3,4);
        local_2d8.fpclass = local_318.fpclass;
        local_2d8.prec_elem = local_318.prec_elem;
        if (((cpp_dec_float<50u,int,void>)bVar5 == (cpp_dec_float<50u,int,void>)0x1) &&
           (local_2d8.data._M_elems[0] = (uint)local_d8,
           local_2d8.data._M_elems[0] != 0 || (int)local_1f8 != 0)) {
          local_2d8.neg = false;
        }
        local_318._48_8_ = uVar6;
        local_2d8.data._M_elems._0_16_ = auVar10;
        if ((((int)local_1f8 != 2) && (local_68.fpclass != cpp_dec_float_NaN)) &&
           (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_2d8,&local_68), piVar16 = local_218, 0 < iVar14)) {
          local_2d8.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
          local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
          local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
          local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
          local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
          local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
          local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
          local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
          local_2d8.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
          local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
          local_2d8.exp = local_318.exp;
          local_2d8.neg = local_318.neg;
          local_2d8.fpclass = local_318.fpclass;
          local_2d8.prec_elem = local_318.prec_elem;
          if (((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) &&
             (local_318.data._M_elems[0] != 0 || local_318.fpclass != 0)) {
            local_2d8.neg = false;
          }
          if (((local_318.fpclass != 2) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_2d8,&local_1e8), 0 < iVar14)) {
            local_1e8.neg = local_318.neg;
            if ((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) {
              local_1e8.neg = local_318.fpclass == 0 && local_318.data._M_elems[0] == 0;
            }
            local_1e8.data._M_elems[0] = local_318.data._M_elems[0];
            local_1e8.data._M_elems[9] = local_318.data._M_elems[9];
            local_1e8.data._M_elems[5] = local_318.data._M_elems[5];
            local_1e8.data._M_elems[6] = local_318.data._M_elems[6];
            local_1e8.data._M_elems[7] = local_318.data._M_elems[7];
            local_1e8.data._M_elems[8] = local_318.data._M_elems[8];
            local_1e8.data._M_elems[1] = local_318.data._M_elems[1];
            local_1e8.data._M_elems[2] = local_318.data._M_elems[2];
            local_1e8.data._M_elems[3] = local_318.data._M_elems[3];
            local_1e8.data._M_elems[4] = local_318.data._M_elems[4];
            local_1e8.exp = local_318.exp;
            local_1e8.fpclass = local_318.fpclass;
            local_1e8.prec_elem = local_318.prec_elem;
          }
          lVar29 = (long)(int)local_250;
          *(ulong *)((long)local_258[lVar29].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
          puVar26 = (uint *)((long)local_258[lVar29].m_backend.data._M_elems + 0x10);
          *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
          *(ulong *)(puVar26 + 2) = CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
          *(ulong *)local_258[lVar29].m_backend.data._M_elems =
               CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
          *(ulong *)((long)local_258[lVar29].m_backend.data._M_elems + 8) =
               CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
          local_258[lVar29].m_backend.exp = local_318.exp;
          local_258[lVar29].m_backend.neg = local_318.neg;
          local_258[lVar29].m_backend.fpclass = local_318.fpclass;
          local_258[lVar29].m_backend.prec_elem = local_318.prec_elem;
          local_270[lVar29] = (int)piVar16;
          if (local_198[(long)piVar16] <= local_268[(long)piVar16]) {
            remaxRow(this,(int)local_240,local_268[(long)piVar16] + 1);
            pcVar38 = (cpp_dec_float<50u,int,void> *)
                      (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_278 = (this->u).row.idx;
          }
          local_250 = CONCAT44(local_250._4_4_,(int)local_250 + 1);
          iVar14 = local_238[(long)piVar16];
          iVar22 = local_268[(long)piVar16];
          local_268[(long)piVar16] = iVar22 + 1;
          lVar29 = (long)iVar14 + (long)iVar22;
          *(ulong *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems +
                    0x20) = CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
          puVar26 = (uint *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data.
                                   _M_elems + 0x10);
          *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
          *(ulong *)(puVar26 + 2) = CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
          *(ulong *)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems =
               CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
          *(ulong *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems + 8
                    ) = CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).exp = local_318.exp;
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).neg = local_318.neg;
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).fpclass = local_318.fpclass;
          (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).prec_elem = local_318.prec_elem;
          local_278[lVar29] = p_col;
          iVar14 = (int)local_288;
          local_288 = (int *)((ulong)local_288 & 0xffffffff);
          if (iVar14 < local_230[(long)piVar16]) {
            local_288 = (int *)(ulong)(uint)local_230[(long)piVar16];
          }
        }
        uVar39 = uVar39 + 1;
      } while (local_248 != (int *)uVar39);
    }
    iVar14 = local_220[local_1b0];
    local_228[local_1b0] = (int)local_250 - iVar14;
    this->nzCnt = this->nzCnt + ((int)local_250 - iVar14);
  }
  piVar13 = local_1a0;
  piVar16 = local_288;
  iVar14 = *(int *)((long)(local_200->m_backend).data._M_elems + local_1b0 * 4);
  iVar22 = (int)local_288;
  uVar18 = iVar22 - iVar14;
  if (uVar18 == 0 || iVar22 < iVar14) {
    if (uVar18 != 0) {
      local_298->stat = SINGULAR;
      puVar17 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_2d8.data._M_elems._0_8_ = local_2d8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d8,"XFORE03 The loaded matrix is singular","");
      *puVar17 = &PTR__SPxException_006a9ee8;
      puVar17[1] = puVar17 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar17 + 1),local_2d8.data._M_elems._0_8_,
                 local_2d8.data._M_elems._0_8_ + local_2d8.data._M_elems._8_8_);
      *puVar17 = &PTR__SPxException_006aa100;
      __cxa_throw(puVar17,&SPxStatusException::typeinfo,SPxException::~SPxException);
    }
    iVar14 = local_1a0[(ulong)local_288 & 0xffffffff];
    iVar22 = local_238[iVar14];
    iVar15 = local_268[iVar14];
    local_268[iVar14] = iVar15 + -1;
    local_188.fpclass = cpp_dec_float_finite;
    local_188.prec_elem = 10;
    local_188.data._M_elems[0] = 0;
    local_188.data._M_elems[1] = 0;
    local_188.data._M_elems[2] = 0;
    local_188.data._M_elems[3] = 0;
    local_188.data._M_elems[4] = 0;
    local_188.data._M_elems[5] = 0;
    local_188.data._M_elems._24_5_ = 0;
    local_188.data._M_elems[7]._1_3_ = 0;
    local_188.data._M_elems._32_5_ = 0;
    local_188.data._M_elems[9]._1_3_ = 0;
    local_188.exp = 0;
    local_188.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_2d8,1,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_188,&local_2d8,
               (cpp_dec_float<50U,_int,_void> *)
               ((long)pcVar38 + ((long)iVar22 + (long)iVar15 + -1) * 0x38));
    pnVar4 = (local_298->diag).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)pnVar4[iVar14].m_backend.data._M_elems + 0x20) =
         CONCAT35(local_188.data._M_elems[9]._1_3_,local_188.data._M_elems._32_5_);
    puVar26 = (uint *)((long)pnVar4[iVar14].m_backend.data._M_elems + 0x10);
    *(undefined8 *)puVar26 = local_188.data._M_elems._16_8_;
    *(ulong *)(puVar26 + 2) =
         CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
    *(undefined8 *)pnVar4[iVar14].m_backend.data._M_elems = local_188.data._M_elems._0_8_;
    *(undefined8 *)((long)pnVar4[iVar14].m_backend.data._M_elems + 8) =
         local_188.data._M_elems._8_8_;
    pnVar4[iVar14].m_backend.exp = local_188.exp;
    pnVar4[iVar14].m_backend.neg = local_188.neg;
    pnVar4[iVar14].m_backend.fpclass = local_188.fpclass;
    pnVar4[iVar14].m_backend.prec_elem = local_188.prec_elem;
    iVar22 = local_228[local_1b0];
    local_228[local_1b0] = iVar22 + -1;
    lVar29 = (long)(iVar22 + -1 + local_220[local_1b0]);
    pfVar12 = &local_258[lVar29 + 1].m_backend.fpclass;
    piVar16 = local_270 + lVar29 + 1;
    do {
      pfVar20 = pfVar12;
      piVar35 = piVar16 + -1;
      piVar13 = piVar16 + -1;
      pfVar12 = pfVar20 + -0xe;
      piVar16 = piVar35;
    } while (*piVar13 != iVar14);
    *piVar35 = local_270[lVar29];
    *(undefined8 *)(pfVar20 + -0x12) =
         *(undefined8 *)((long)local_258[lVar29].m_backend.data._M_elems + 0x20);
    uVar3 = *(undefined8 *)local_258[lVar29].m_backend.data._M_elems;
    uVar6 = *(undefined8 *)((long)local_258[lVar29].m_backend.data._M_elems + 8);
    puVar26 = (uint *)((long)local_258[lVar29].m_backend.data._M_elems + 0x10);
    uVar7 = *(undefined8 *)(puVar26 + 2);
    *(undefined8 *)(pfVar20 + -0x16) = *(undefined8 *)puVar26;
    *(undefined8 *)(pfVar20 + -0x14) = uVar7;
    *(undefined8 *)(pfVar20 + -0x1a) = uVar3;
    *(undefined8 *)(pfVar20 + -0x18) = uVar6;
    pfVar20[-0x10] = local_258[lVar29].m_backend.exp;
    *(bool *)(pfVar20 + -0xf) = local_258[lVar29].m_backend.neg;
    *(undefined8 *)(pfVar20 + -0xe) = *(undefined8 *)&local_258[lVar29].m_backend.fpclass;
  }
  else {
    local_2e0 = (cpp_dec_float<50u,int,void> *)(long)iVar14;
    piVar35 = local_1a0 + (long)local_2e0;
    iVar15 = *piVar35;
    local_218 = (int *)((long)local_2e0 + 1);
    local_1f8 = (long)(ulong)uVar18 * 4;
    local_248 = (int *)(ulong)uVar18;
    memmove(piVar35,local_1a0 + (long)local_2e0 + 1,local_1f8);
    piVar11 = local_208;
    local_250 = (ulong)piVar16 & 0xffffffff;
    piVar13[local_250] = iVar15;
    iVar22 = iVar22 + 1;
    local_240 = (pointer)CONCAT44(local_240._4_4_,iVar14);
    do {
      local_230[*piVar35] = iVar14;
      iVar14 = iVar14 + 1;
      piVar35 = piVar35 + 1;
    } while (iVar22 != iVar14);
    piVar16 = local_208 + (long)local_2e0;
    iVar14 = *piVar16;
    memmove(piVar16,local_208 + (long)local_218,local_1f8);
    pnVar34 = local_280;
    pCVar24 = local_298;
    piVar11[local_250] = iVar14;
    iVar14 = (int)local_240;
    if ((int)local_240 <= (int)local_288) {
      do {
        *(int *)((long)(local_200->m_backend).data._M_elems + (long)*piVar16 * 4) = iVar14;
        iVar14 = iVar14 + 1;
        piVar16 = piVar16 + 1;
      } while (iVar22 != iVar14);
    }
    iVar14 = local_1a0[local_250];
    local_230 = (int *)(long)iVar14;
    iVar15 = local_238[(long)local_230];
    uVar18 = local_268[(long)local_230];
    local_298->nzCnt = local_298->nzCnt - uVar18;
    uVar39 = (long)iVar15 + -1 + (long)(int)uVar18;
    local_1f8 = CONCAT44(local_1f8._4_4_,iVar14);
    iVar30 = (int)uVar39;
    if ((double)((int)local_260 - (int)local_240) * 0.001 <= (double)(int)uVar18) {
      if (iVar15 <= iVar30) {
        lVar29 = (long)iVar30;
        do {
          iVar30 = local_278[lVar29];
          *(undefined8 *)(local_280[iVar30].m_backend.data._M_elems + 8) =
               *(undefined8 *)
                ((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems + 0x20)
          ;
          uVar3 = *(undefined8 *)
                   (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems;
          uVar6 = *(undefined8 *)
                   ((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems + 8)
          ;
          puVar26 = (uint *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data.
                                   _M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar26 + 2);
          puVar1 = local_280[iVar30].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = *(undefined8 *)puVar26;
          *(undefined8 *)(puVar1 + 2) = uVar7;
          *(undefined8 *)local_280[iVar30].m_backend.data._M_elems = uVar3;
          *(undefined8 *)(local_280[iVar30].m_backend.data._M_elems + 2) = uVar6;
          local_280[iVar30].m_backend.exp =
               (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).exp;
          local_280[iVar30].m_backend.neg =
               (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).neg;
          iVar9 = (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).prec_elem;
          local_280[iVar30].m_backend.fpclass =
               (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).fpclass;
          local_280[iVar30].m_backend.prec_elem = iVar9;
          iVar2 = local_228[iVar30];
          local_228[iVar30] = iVar2 + -1;
          lVar41 = (long)(iVar2 + -1 + local_220[iVar30]);
          pfVar12 = &local_258[lVar41 + 1].m_backend.fpclass;
          piVar16 = local_270 + lVar41 + 1;
          do {
            pfVar20 = pfVar12;
            piVar35 = piVar16 + -1;
            piVar13 = piVar16 + -1;
            pfVar12 = pfVar20 + -0xe;
            piVar16 = piVar35;
          } while (*piVar13 != iVar14);
          *piVar35 = local_270[lVar41];
          *(undefined8 *)(pfVar20 + -0x12) =
               *(undefined8 *)((long)local_258[lVar41].m_backend.data._M_elems + 0x20);
          uVar3 = *(undefined8 *)local_258[lVar41].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)((long)local_258[lVar41].m_backend.data._M_elems + 8);
          puVar26 = (uint *)((long)local_258[lVar41].m_backend.data._M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar26 + 2);
          *(undefined8 *)(pfVar20 + -0x16) = *(undefined8 *)puVar26;
          *(undefined8 *)(pfVar20 + -0x14) = uVar7;
          *(undefined8 *)(pfVar20 + -0x1a) = uVar3;
          *(undefined8 *)(pfVar20 + -0x18) = uVar6;
          pfVar20[-0x10] = local_258[lVar41].m_backend.exp;
          *(bool *)(pfVar20 + -0xf) = local_258[lVar41].m_backend.neg;
          *(undefined8 *)(pfVar20 + -0xe) = *(undefined8 *)&local_258[lVar41].m_backend.fpclass;
          bVar5 = iVar15 < lVar29;
          lVar29 = lVar29 + -1;
        } while (bVar5);
      }
      local_290 = (uint *)CONCAT44(local_290._4_4_,iVar22);
      iVar14 = makeLvec(local_298,(int)local_248,iVar14);
      local_218 = (int *)CONCAT44(local_218._4_4_,iVar14);
      if ((int)local_240 < (int)local_288) {
        local_200 = (pCVar24->l).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_240 = (pointer)(pCVar24->l).idx;
        pcVar21 = local_2e0;
        piVar16 = local_288;
        do {
          pcVar23 = &local_280[local_208[(long)pcVar21]].m_backend;
          local_2e0 = pcVar21;
          if (local_280[local_208[(long)pcVar21]].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00283cdf:
            iVar14 = local_1a0[(long)local_2e0];
            pcVar40 = &(pCVar24->diag).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar14].m_backend;
            local_2d8.fpclass = cpp_dec_float_finite;
            local_2d8.prec_elem = 10;
            local_2d8.data._M_elems._0_16_ = ZEXT816(0);
            local_2d8.data._M_elems[4] = 0;
            local_2d8.data._M_elems[5] = 0;
            local_2d8.data._M_elems._24_5_ = 0;
            local_2d8.data._M_elems[7]._1_3_ = 0;
            local_2d8.data._M_elems._32_5_ = 0;
            local_2d8.data._M_elems[9]._1_3_ = 0;
            local_2d8.exp = 0;
            local_2d8.neg = false;
            pcVar27 = pcVar23;
            if ((&local_2d8 != pcVar40) && (pcVar27 = pcVar40, &local_2d8 != pcVar23)) {
              uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
              local_2d8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_2d8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar23->data)._M_elems;
              local_2d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
              local_2d8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_2d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_2d8.exp = pcVar23->exp;
              local_2d8.neg = pcVar23->neg;
              local_2d8.fpclass = pcVar23->fpclass;
              local_2d8.prec_elem = pcVar23->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_2d8,pcVar27);
            local_318.data._M_elems[0] = local_2d8.data._M_elems[0];
            local_318.data._M_elems[1] = local_2d8.data._M_elems[1];
            local_318.data._M_elems[2] = local_2d8.data._M_elems[2];
            local_318.data._M_elems[3] = local_2d8.data._M_elems[3];
            local_318.data._M_elems[4] = local_2d8.data._M_elems[4];
            local_318.data._M_elems[5] = local_2d8.data._M_elems[5];
            local_318.data._M_elems[6] = local_2d8.data._M_elems[6];
            local_318.data._M_elems[7] =
                 (uint)(CONCAT35(local_2d8.data._M_elems[7]._1_3_,local_2d8.data._M_elems._24_5_) >>
                       0x20);
            local_318.data._M_elems[8] = local_2d8.data._M_elems[8];
            local_318.data._M_elems[9] =
                 (uint)(CONCAT35(local_2d8.data._M_elems[9]._1_3_,local_2d8.data._M_elems._32_5_) >>
                       0x20);
            local_318.exp = local_2d8.exp;
            local_318.neg = local_2d8.neg;
            local_318.fpclass = local_2d8.fpclass;
            local_318.prec_elem = local_2d8.prec_elem;
            lVar29 = (long)(int)local_218;
            *(int *)((long)(local_240->m_backend).data._M_elems + lVar29 * 4) = iVar14;
            *(ulong *)((long)local_200[lVar29].m_backend.data._M_elems + 0x20) =
                 CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
            puVar26 = (uint *)((long)local_200[lVar29].m_backend.data._M_elems + 0x10);
            *(undefined8 *)puVar26 = local_2d8.data._M_elems._16_8_;
            *(ulong *)(puVar26 + 2) =
                 CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
            *(undefined8 *)&local_200[lVar29].m_backend.data = local_2d8.data._M_elems._0_8_;
            *(undefined8 *)((long)&local_200[lVar29].m_backend.data + 8) =
                 local_2d8.data._M_elems._8_8_;
            local_200[lVar29].m_backend.exp = local_2d8.exp;
            local_200[lVar29].m_backend.neg = local_2d8.neg;
            local_200[lVar29].m_backend.fpclass = local_2d8.fpclass;
            local_200[lVar29].m_backend.prec_elem = local_2d8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)pcVar23,0.0);
            pCVar24 = local_298;
            local_2d8.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
            local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
            local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
            local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
            local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
            local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
            local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
            local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
            local_2d8.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
            local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
            local_2d8.exp = local_318.exp;
            local_2d8.neg = local_318.neg;
            local_2d8.fpclass = local_318.fpclass;
            local_2d8.prec_elem = local_318.prec_elem;
            if (((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) &&
               (local_318.data._M_elems[0] != 0 || local_318.fpclass != 0)) {
              local_2d8.neg = false;
            }
            if (((local_318.fpclass != 2) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
               (iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_2d8,&local_1e8), 0 < iVar22)) {
              local_1e8.neg = local_318.neg;
              if ((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) {
                local_1e8.neg = local_318.fpclass == 0 && local_318.data._M_elems[0] == 0;
              }
              local_1e8.data._M_elems[0] = local_318.data._M_elems[0];
              local_1e8.data._M_elems[9] = local_318.data._M_elems[9];
              local_1e8.data._M_elems[5] = local_318.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_318.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_318.data._M_elems[7];
              local_1e8.data._M_elems[8] = local_318.data._M_elems[8];
              local_1e8.data._M_elems[1] = local_318.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_318.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_318.data._M_elems[3];
              local_1e8.data._M_elems[4] = local_318.data._M_elems[4];
              local_1e8.exp = local_318.exp;
              local_1e8.fpclass = local_318.fpclass;
              local_1e8.prec_elem = local_318.prec_elem;
            }
            local_218 = (int *)CONCAT44(local_218._4_4_,(int)local_218 + 1);
            piVar16 = local_288;
            if (0 < (long)local_268[iVar14]) {
              lVar29 = (long)local_238[iVar14];
              lVar41 = local_268[iVar14] + lVar29;
              pcVar23 = (cpp_dec_float<50U,_int,_void> *)((long)pcVar38 + lVar29 * 0x38);
              do {
                local_2d8.fpclass = cpp_dec_float_finite;
                local_2d8.prec_elem = 10;
                local_2d8.data._M_elems[0] = 0;
                local_2d8.data._M_elems[1] = 0;
                local_2d8.data._M_elems[2] = 0;
                local_2d8.data._M_elems[3] = 0;
                local_2d8.data._M_elems[4] = 0;
                local_2d8.data._M_elems[5] = 0;
                local_2d8.data._M_elems._24_5_ = 0;
                local_2d8.data._M_elems[7]._1_3_ = 0;
                local_2d8.data._M_elems._32_5_ = 0;
                local_2d8.data._M_elems[9]._1_3_ = 0;
                local_2d8.exp = 0;
                local_2d8.neg = false;
                pcVar27 = &local_318;
                if (pcVar23 != &local_2d8) {
                  local_2d8.data._M_elems._32_5_ =
                       SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
                  local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
                  local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
                  local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
                  local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
                  local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
                  local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
                  local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
                  local_2d8.data._M_elems._24_5_ =
                       SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
                  local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
                  local_2d8.exp = local_318.exp;
                  local_2d8.neg = local_318.neg;
                  local_2d8.fpclass = local_318.fpclass;
                  local_2d8.prec_elem = local_318.prec_elem;
                  pcVar27 = pcVar23;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_2d8,pcVar27);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_280[local_278[lVar29]].m_backend,&local_2d8);
                lVar29 = lVar29 + 1;
                pcVar23 = pcVar23 + 1;
                pCVar24 = local_298;
                piVar16 = local_288;
              } while (lVar29 < lVar41);
            }
          }
          else {
            local_2d8.fpclass = cpp_dec_float_finite;
            local_2d8.prec_elem = 10;
            local_2d8.data._M_elems._0_16_ = ZEXT816(0);
            local_2d8.data._M_elems[4] = 0;
            local_2d8.data._M_elems[5] = 0;
            local_2d8.data._M_elems._24_5_ = 0;
            local_2d8.data._M_elems[7]._1_3_ = 0;
            local_2d8.data._M_elems._32_5_ = 0;
            local_2d8.data._M_elems[9]._1_3_ = 0;
            local_2d8.exp = 0;
            local_2d8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2d8,0.0);
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar23,&local_2d8);
            if (iVar14 != 0) goto LAB_00283cdf;
          }
          pcVar21 = (cpp_dec_float<50u,int,void> *)((long)local_2e0 + 1);
        } while ((int)piVar16 != (int)pcVar21);
      }
      pnVar34 = local_280;
      puVar26 = local_290;
      iVar14 = (pCVar24->l).firstUnused;
      if (local_190[(long)iVar14 + -1] == (int)local_218) {
        (pCVar24->l).firstUnused = iVar14 + -1;
      }
      else {
        local_190[iVar14] = (int)local_218;
      }
      iVar22 = (int)local_290;
      iVar14 = local_208[local_250];
      uVar3 = *(undefined8 *)(local_280[iVar14].m_backend.data._M_elems + 8);
      local_318.data._M_elems[8] = (uint)uVar3;
      local_318.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)local_280[iVar14].m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(local_280[iVar14].m_backend.data._M_elems + 2);
      puVar1 = local_280[iVar14].m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      local_318.data._M_elems[4] = (uint)uVar7;
      local_318.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
      local_318.data._M_elems[6] = (uint)uVar8;
      local_318.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
      local_318.data._M_elems[0] = (uint)uVar3;
      local_318.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
      local_318.data._M_elems[2] = (uint)uVar6;
      local_318.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
      local_318.exp = local_280[iVar14].m_backend.exp;
      local_318.neg = local_280[iVar14].m_backend.neg;
      local_318.fpclass = local_280[iVar14].m_backend.fpclass;
      local_318.prec_elem = local_280[iVar14].m_backend.prec_elem;
      if (local_318.fpclass != cpp_dec_float_NaN) {
        local_2d8.fpclass = cpp_dec_float_finite;
        local_2d8.prec_elem = 10;
        local_2d8.data._M_elems._0_16_ = ZEXT816(0);
        local_2d8.data._M_elems[4] = 0;
        local_2d8.data._M_elems[5] = 0;
        local_2d8.data._M_elems._24_5_ = 0;
        local_2d8.data._M_elems[7]._1_3_ = 0;
        local_2d8.data._M_elems._32_5_ = 0;
        local_2d8.data._M_elems[9]._1_3_ = 0;
        local_2d8.exp = 0;
        local_2d8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_2d8,0.0);
        iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_318,&local_2d8);
        if (iVar15 == 0) {
          local_298->stat = SINGULAR;
          puVar17 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_2d8.data._M_elems._0_8_ = local_2d8.data._M_elems + 4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,"XFORE02 The loaded matrix is singular","");
          *puVar17 = &PTR__SPxException_006a9ee8;
          puVar17[1] = puVar17 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar17 + 1),local_2d8.data._M_elems._0_8_,
                     local_2d8.data._M_elems._0_8_ + local_2d8.data._M_elems._8_8_);
          *puVar17 = &PTR__SPxException_006aa100;
          __cxa_throw(puVar17,&SPxStatusException::typeinfo,SPxException::~SPxException);
        }
      }
      local_188.fpclass = cpp_dec_float_finite;
      local_188.prec_elem = 10;
      local_188.data._M_elems._0_16_ = ZEXT816(0);
      local_188.data._M_elems[4] = 0;
      local_188.data._M_elems[5] = 0;
      local_188.data._M_elems._24_5_ = 0;
      local_188.data._M_elems[7]._1_3_ = 0;
      local_188.data._M_elems._32_5_ = 0;
      local_188.data._M_elems[9]._1_3_ = 0;
      local_188.exp = 0;
      local_188.neg = false;
      iVar15 = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_2d8,1,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_188,&local_2d8,&local_318);
      pnVar4 = (local_298->diag).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar4[(long)local_230].m_backend.data._M_elems + 0x20) =
           CONCAT35(local_188.data._M_elems[9]._1_3_,local_188.data._M_elems._32_5_);
      puVar1 = (uint *)((long)pnVar4[(long)local_230].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar1 = local_188.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
      *(undefined8 *)pnVar4[(long)local_230].m_backend.data._M_elems = local_188.data._M_elems._0_8_
      ;
      *(undefined8 *)((long)pnVar4[(long)local_230].m_backend.data._M_elems + 8) =
           local_188.data._M_elems._8_8_;
      pnVar4[(long)local_230].m_backend.exp = local_188.exp;
      pnVar4[(long)local_230].m_backend.neg = local_188.neg;
      pnVar4[(long)local_230].m_backend.fpclass = local_188.fpclass;
      pnVar4[(long)local_230].m_backend.prec_elem = local_188.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)(pnVar34 + iVar14),0.0);
      local_2e0 = (cpp_dec_float<50u,int,void> *)((ulong)puVar26 & 0xffffffff);
      if (iVar22 < (int)local_260) {
        piVar16 = local_208 + (long)local_2e0;
        iVar15 = 0;
        uVar39 = local_260;
        iVar14 = (int)local_290;
        do {
          uVar18 = 1;
          if (local_280[*piVar16].m_backend.fpclass != cpp_dec_float_NaN) {
            pcVar23 = &local_280[*piVar16].m_backend;
            local_2d8.fpclass = cpp_dec_float_finite;
            local_2d8.prec_elem = 10;
            local_2d8.data._M_elems._0_16_ = ZEXT816(0);
            local_2d8.data._M_elems[4] = 0;
            local_2d8.data._M_elems[5] = 0;
            local_2d8.data._M_elems._24_5_ = 0;
            local_2d8.data._M_elems[7]._1_3_ = 0;
            local_2d8.data._M_elems._32_5_ = 0;
            local_2d8.data._M_elems[9]._1_3_ = 0;
            local_2d8.exp = 0;
            local_2d8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2d8,0.0);
            iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar23,&local_2d8);
            uVar18 = (uint)(iVar22 != 0);
            uVar39 = local_260;
          }
          iVar15 = iVar15 + uVar18;
          piVar16 = piVar16 + 1;
          iVar14 = iVar14 + 1;
        } while (iVar14 < (int)uVar39);
      }
      pCVar24 = local_298;
      if (local_198[(long)local_230] < iVar15) {
        local_268[(long)local_230] = 0;
        remaxRow(local_298,(int)local_1f8,iVar15);
        pcVar38 = (cpp_dec_float<50u,int,void> *)
                  (pCVar24->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_278 = (pCVar24->u).row.idx;
      }
      local_298->nzCnt = local_298->nzCnt + iVar15;
      iVar14 = local_238[(long)local_230];
      if ((int)local_290 < (int)local_260) {
        pcVar21 = (cpp_dec_float<50u,int,void> *)(local_208 + (long)local_2e0);
        iVar22 = (int)local_290;
        do {
          local_290 = (uint *)CONCAT44(local_290._4_4_,iVar22);
          iVar22 = *(int *)pcVar21;
          uVar3 = *(undefined8 *)(local_280[iVar22].m_backend.data._M_elems + 8);
          local_318.data._M_elems[8] = (uint)uVar3;
          local_318.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
          uVar3 = *(undefined8 *)local_280[iVar22].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)(local_280[iVar22].m_backend.data._M_elems + 2);
          puVar26 = local_280[iVar22].m_backend.data._M_elems + 4;
          uVar7 = *(undefined8 *)puVar26;
          uVar8 = *(undefined8 *)(puVar26 + 2);
          local_318.data._M_elems[4] = (uint)uVar7;
          local_318.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_318.data._M_elems[6] = (uint)uVar8;
          local_318.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_318.data._M_elems[0] = (uint)uVar3;
          local_318.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
          local_318.data._M_elems[2] = (uint)uVar6;
          local_318.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_318.exp = local_280[iVar22].m_backend.exp;
          local_318.neg = local_280[iVar22].m_backend.neg;
          local_318.fpclass = local_280[iVar22].m_backend.fpclass;
          local_318.prec_elem = local_280[iVar22].m_backend.prec_elem;
          if (local_318.fpclass == 2) {
LAB_0028438c:
            local_2d8.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
            local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
            local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
            local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
            local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
            local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
            local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
            local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
            local_2d8.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
            local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
            local_2d8.exp = local_318.exp;
            local_2d8.neg = local_318.neg;
            local_2d8.fpclass = local_318.fpclass;
            local_2d8.prec_elem = local_318.prec_elem;
            if (((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) &&
               (local_318.data._M_elems[0] != 0 || local_318.fpclass != 0)) {
              local_2d8.neg = false;
            }
            if (((local_318.fpclass != 2) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_2d8,&local_1e8), 0 < iVar15)) {
              local_1e8.neg = local_318.neg;
              if ((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) {
                local_1e8.neg = local_318.fpclass == 0 && local_318.data._M_elems[0] == 0;
              }
              local_1e8.data._M_elems[0] = local_318.data._M_elems[0];
              local_1e8.data._M_elems[9] = local_318.data._M_elems[9];
              local_1e8.data._M_elems[5] = local_318.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_318.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_318.data._M_elems[7];
              local_1e8.data._M_elems[8] = local_318.data._M_elems[8];
              local_1e8.data._M_elems[1] = local_318.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_318.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_318.data._M_elems[3];
              local_1e8.data._M_elems[4] = local_318.data._M_elems[4];
              local_1e8.exp = local_318.exp;
              local_1e8.fpclass = local_318.fpclass;
              local_1e8.prec_elem = local_318.prec_elem;
            }
            local_278[iVar14] = iVar22;
            *(ulong *)((long)(((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).data.
                             _M_elems + 0x20) =
                 CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
            puVar26 = (uint *)((long)(((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).
                                     data._M_elems + 0x10);
            *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
            *(ulong *)(puVar26 + 2) =
                 CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
            *(ulong *)(((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).data._M_elems =
                 CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
            *(ulong *)((long)(((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).data.
                             _M_elems + 8) =
                 CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
            (((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).exp = local_318.exp;
            (((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).neg = local_318.neg;
            (((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).fpclass =
                 local_318.fpclass;
            (((pointer)((long)pcVar38 + (long)iVar14 * 0x38))->m_backend).prec_elem =
                 local_318.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)(local_280 + iVar22),0.0);
            pCVar24 = local_298;
            if (local_1a8[iVar22] <= local_228[iVar22]) {
              forestReMaxCol(local_298,iVar22,local_228[iVar22] + 1);
              local_270 = (pCVar24->u).col.idx;
              local_258 = (pCVar24->u).col.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            }
            iVar14 = iVar14 + 1;
            lVar29 = (long)local_228[iVar22] + (long)local_220[iVar22];
            *(ulong *)((long)local_258[lVar29].m_backend.data._M_elems + 0x20) =
                 CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
            puVar26 = (uint *)((long)local_258[lVar29].m_backend.data._M_elems + 0x10);
            *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
            *(ulong *)(puVar26 + 2) =
                 CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
            *(ulong *)local_258[lVar29].m_backend.data._M_elems =
                 CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
            *(ulong *)((long)local_258[lVar29].m_backend.data._M_elems + 8) =
                 CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
            local_258[lVar29].m_backend.exp = local_318.exp;
            local_258[lVar29].m_backend.neg = local_318.neg;
            local_258[lVar29].m_backend.fpclass = local_318.fpclass;
            local_258[lVar29].m_backend.prec_elem = local_318.prec_elem;
            iVar15 = local_220[iVar22];
            iVar30 = local_228[iVar22];
            local_228[iVar22] = iVar30 + 1;
            local_270[(long)iVar15 + (long)iVar30] = (int)local_1f8;
          }
          else {
            local_2d8.fpclass = cpp_dec_float_finite;
            local_2d8.prec_elem = 10;
            local_2d8.data._M_elems._0_16_ = ZEXT816(0);
            local_2d8.data._M_elems[4] = 0;
            local_2d8.data._M_elems[5] = 0;
            local_2d8.data._M_elems._24_5_ = 0;
            local_2d8.data._M_elems[7]._1_3_ = 0;
            local_2d8.data._M_elems._32_5_ = 0;
            local_2d8.data._M_elems[9]._1_3_ = 0;
            local_2d8.exp = 0;
            local_2d8.neg = false;
            local_2e0 = pcVar21;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2d8,0.0);
            pcVar21 = local_2e0;
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_318,&local_2d8);
            if (iVar15 != 0) goto LAB_0028438c;
          }
          pcVar21 = (cpp_dec_float<50u,int,void> *)((long)pcVar21 + 4);
          iVar22 = (int)local_290 + 1;
        } while (iVar22 < (int)local_260);
      }
      local_268[(long)local_230] = iVar14 - local_238[(long)local_230];
    }
    else {
      uVar37 = 0;
      if (iVar15 <= iVar30) {
        local_218 = local_270 + 1;
        uVar25 = 0;
        do {
          lVar29 = (long)local_278[uVar39];
          *(undefined8 *)(local_280[lVar29].m_backend.data._M_elems + 8) =
               *(undefined8 *)
                ((long)(((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).data._M_elems + 0x20)
          ;
          uVar3 = *(undefined8 *)
                   (((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).data._M_elems;
          uVar6 = *(undefined8 *)
                   ((long)(((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).data._M_elems + 8)
          ;
          puVar26 = (uint *)((long)(((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).data.
                                   _M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar26 + 2);
          puVar1 = local_280[lVar29].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = *(undefined8 *)puVar26;
          *(undefined8 *)(puVar1 + 2) = uVar7;
          *(undefined8 *)local_280[lVar29].m_backend.data._M_elems = uVar3;
          *(undefined8 *)(local_280[lVar29].m_backend.data._M_elems + 2) = uVar6;
          local_280[lVar29].m_backend.exp =
               (((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).exp;
          local_280[lVar29].m_backend.neg =
               (((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).neg;
          iVar9 = (((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).prec_elem;
          local_280[lVar29].m_backend.fpclass =
               (((pointer)((long)pcVar38 + uVar39 * 0x38))->m_backend).fpclass;
          local_280[lVar29].m_backend.prec_elem = iVar9;
          uVar37 = *(uint *)((long)(local_200->m_backend).data._M_elems + lVar29 * 4);
          uVar19 = uVar25;
          if (uVar25 != 0) {
            do {
              uVar33 = uVar19 - 1;
              uVar31 = uVar33 >> 1;
              if ((int)local_290[uVar31] <= (int)uVar37) break;
              local_290[uVar19] = local_290[uVar31];
              uVar19 = uVar31;
            } while (1 < uVar33);
          }
          uVar25 = uVar25 + 1;
          local_290[(int)uVar19] = uVar37;
          iVar22 = local_228[lVar29];
          local_228[lVar29] = iVar22 + -1;
          lVar29 = (long)(iVar22 + -1 + local_220[lVar29]);
          pfVar12 = &local_258[lVar29 + 1].m_backend.fpclass;
          piVar16 = local_218 + lVar29;
          do {
            pfVar20 = pfVar12;
            piVar35 = piVar16 + -1;
            piVar13 = piVar16 + -1;
            pfVar12 = pfVar20 + -0xe;
            piVar16 = piVar35;
          } while (*piVar13 != iVar14);
          *piVar35 = local_270[lVar29];
          *(undefined8 *)(pfVar20 + -0x12) =
               *(undefined8 *)((long)local_258[lVar29].m_backend.data._M_elems + 0x20);
          uVar3 = *(undefined8 *)local_258[lVar29].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)((long)local_258[lVar29].m_backend.data._M_elems + 8);
          puVar26 = (uint *)((long)local_258[lVar29].m_backend.data._M_elems + 0x10);
          uVar7 = *(undefined8 *)(puVar26 + 2);
          *(undefined8 *)(pfVar20 + -0x16) = *(undefined8 *)puVar26;
          *(undefined8 *)(pfVar20 + -0x14) = uVar7;
          *(undefined8 *)(pfVar20 + -0x1a) = uVar3;
          *(undefined8 *)(pfVar20 + -0x18) = uVar6;
          pfVar20[-0x10] = local_258[lVar29].m_backend.exp;
          *(bool *)(pfVar20 + -0xf) = local_258[lVar29].m_backend.neg;
          *(undefined8 *)(pfVar20 + -0xe) = *(undefined8 *)&local_258[lVar29].m_backend.fpclass;
          uVar39 = uVar39 - 1;
          uVar37 = uVar18;
        } while (uVar25 != uVar18);
      }
      local_2e0 = pcVar38;
      uVar18 = makeLvec(local_298,(int)local_248,iVar14);
      piVar16 = (int *)(ulong)uVar18;
      if (uVar37 == 0) {
        uVar25 = (uint)local_288;
        uVar18 = 0;
      }
      else {
        local_240 = (pCVar24->l).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_248 = (pCVar24->l).idx;
        piVar16 = (int *)(long)(int)uVar18;
        do {
          uVar25 = (uint)local_288;
          uVar19 = *local_290;
          uVar39 = (ulong)uVar19;
          uVar18 = uVar37 - 1;
          uVar31 = local_290[(long)(int)uVar37 + -1];
          iVar14 = 1;
          iVar22 = 0;
          if (3 < (int)uVar37) {
            iVar22 = 0;
            do {
              uVar33 = local_290[iVar14];
              uVar28 = local_290[(long)iVar14 + 1];
              puVar26 = local_290 + iVar22;
              if ((int)uVar33 < (int)uVar28) {
                iVar22 = iVar14;
                uVar28 = uVar33;
                if ((int)uVar31 <= (int)uVar33) goto LAB_002833f1;
              }
              else {
                if ((int)uVar31 <= (int)uVar28) goto LAB_002833f1;
                iVar22 = iVar14 + 1;
              }
              *puVar26 = uVar28;
              iVar14 = iVar22 * 2 + 1;
            } while (iVar14 < (int)(uVar37 - 2));
          }
          if ((iVar14 < (int)uVar18) && ((int)local_290[iVar14] < (int)uVar31)) {
            local_290[iVar22] = local_290[iVar14];
            iVar22 = iVar14;
          }
          puVar26 = local_290 + iVar22;
LAB_002833f1:
          *puVar26 = uVar31;
          local_260 = uVar39;
          local_218 = piVar16;
          if (uVar19 == uVar25) {
            pCVar24 = local_298;
            iVar14 = (int)local_1f8;
            goto LAB_00284619;
          }
          iVar14 = local_1a0[(int)uVar19];
          pcVar40 = &pnVar34[local_208[(int)uVar19]].m_backend;
          pcVar27 = &(local_298->diag).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar14].m_backend;
          local_2d8.fpclass = cpp_dec_float_finite;
          local_2d8.prec_elem = 10;
          local_2d8.data._M_elems._0_16_ = ZEXT816(0);
          local_2d8.data._M_elems[4] = 0;
          local_2d8.data._M_elems[5] = 0;
          local_2d8.data._M_elems._24_5_ = 0;
          local_2d8.data._M_elems[7]._1_3_ = 0;
          local_2d8.data._M_elems._32_5_ = 0;
          local_2d8.data._M_elems[9]._1_3_ = 0;
          local_2d8.exp = 0;
          local_2d8.neg = false;
          pcVar23 = pcVar40;
          if ((&local_2d8 != pcVar27) && (pcVar23 = pcVar27, &local_2d8 != pcVar40)) {
            uVar3 = *(undefined8 *)((pcVar40->data)._M_elems + 8);
            local_2d8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_2d8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar40->data)._M_elems;
            local_2d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar40->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar40->data)._M_elems + 6);
            local_2d8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_2d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_2d8.exp = pcVar40->exp;
            local_2d8.neg = pcVar40->neg;
            local_2d8.fpclass = pcVar40->fpclass;
            local_2d8.prec_elem = pcVar40->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_2d8,pcVar23);
          local_318.data._M_elems[0] = local_2d8.data._M_elems[0];
          local_318.data._M_elems[1] = local_2d8.data._M_elems[1];
          local_318.data._M_elems[2] = local_2d8.data._M_elems[2];
          local_318.data._M_elems[3] = local_2d8.data._M_elems[3];
          local_318.data._M_elems[4] = local_2d8.data._M_elems[4];
          local_318.data._M_elems[5] = local_2d8.data._M_elems[5];
          local_318.data._M_elems[6] = local_2d8.data._M_elems[6];
          local_318.data._M_elems[7] =
               (uint)(CONCAT35(local_2d8.data._M_elems[7]._1_3_,local_2d8.data._M_elems._24_5_) >>
                     0x20);
          local_318.data._M_elems[8] = local_2d8.data._M_elems[8];
          local_318.data._M_elems[9] =
               (uint)(CONCAT35(local_2d8.data._M_elems[9]._1_3_,local_2d8.data._M_elems._32_5_) >>
                     0x20);
          local_318.exp = local_2d8.exp;
          local_318.neg = local_2d8.neg;
          local_318.fpclass = local_2d8.fpclass;
          local_318.prec_elem = local_2d8.prec_elem;
          local_248[(long)local_218] = iVar14;
          *(ulong *)((long)local_240[(long)local_218].m_backend.data._M_elems + 0x20) =
               CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
          puVar26 = (uint *)((long)local_240[(long)local_218].m_backend.data._M_elems + 0x10);
          *(undefined8 *)puVar26 = local_2d8.data._M_elems._16_8_;
          *(ulong *)(puVar26 + 2) = CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
          *(undefined8 *)&local_240[(long)local_218].m_backend.data = local_2d8.data._M_elems._0_8_;
          *(undefined8 *)((long)&local_240[(long)local_218].m_backend.data + 8) =
               local_2d8.data._M_elems._8_8_;
          local_240[(long)local_218].m_backend.exp = local_2d8.exp;
          local_240[(long)local_218].m_backend.neg = local_2d8.neg;
          local_240[(long)local_218].m_backend.fpclass = local_2d8.fpclass;
          local_240[(long)local_218].m_backend.prec_elem = local_2d8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)pcVar40,0.0);
          local_2d8.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
          local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
          local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
          local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
          local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
          local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
          local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
          local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
          local_2d8.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
          local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
          local_2d8.exp = local_318.exp;
          local_2d8.neg = local_318.neg;
          local_2d8.fpclass = local_318.fpclass;
          local_2d8.prec_elem = local_318.prec_elem;
          if (((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) &&
             (local_318.data._M_elems[0] != 0 || local_318.fpclass != 0)) {
            local_2d8.neg = false;
          }
          if (((local_318.fpclass != 2) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
             (iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_2d8,&local_1e8), 0 < iVar22)) {
            local_1e8.neg = local_318.neg;
            if ((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) {
              local_1e8.neg = local_318.fpclass == 0 && local_318.data._M_elems[0] == 0;
            }
            local_1e8.data._M_elems[0] = local_318.data._M_elems[0];
            local_1e8.data._M_elems[9] = local_318.data._M_elems[9];
            local_1e8.data._M_elems[5] = local_318.data._M_elems[5];
            local_1e8.data._M_elems[6] = local_318.data._M_elems[6];
            local_1e8.data._M_elems[7] = local_318.data._M_elems[7];
            local_1e8.data._M_elems[8] = local_318.data._M_elems[8];
            local_1e8.data._M_elems[1] = local_318.data._M_elems[1];
            local_1e8.data._M_elems[2] = local_318.data._M_elems[2];
            local_1e8.data._M_elems[3] = local_318.data._M_elems[3];
            local_1e8.data._M_elems[4] = local_318.data._M_elems[4];
            local_1e8.exp = local_318.exp;
            local_1e8.fpclass = local_318.fpclass;
            local_1e8.prec_elem = local_318.prec_elem;
          }
          uVar37 = uVar18;
          if (0 < (long)local_268[iVar14]) {
            lVar29 = (long)local_238[iVar14];
            lVar41 = local_268[iVar14] + lVar29;
            do {
              lVar32 = (long)local_278[lVar29];
              uVar3 = *(undefined8 *)(pnVar34[lVar32].m_backend.data._M_elems + 8);
              local_188.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_188.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_188.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])pnVar34[lVar32].m_backend.data._M_elems;
              puVar26 = pnVar34[lVar32].m_backend.data._M_elems + 4;
              local_188.data._M_elems._16_8_ = *(undefined8 *)puVar26;
              uVar3 = *(undefined8 *)(puVar26 + 2);
              local_188.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_188.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_188.exp = pnVar34[lVar32].m_backend.exp;
              local_188.neg = pnVar34[lVar32].m_backend.neg;
              local_188.fpclass = pnVar34[lVar32].m_backend.fpclass;
              local_188.prec_elem = pnVar34[lVar32].m_backend.prec_elem;
              if (local_188.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_2d8,0,(type *)0x0);
                iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_188,&local_2d8);
                if (iVar14 == 0) {
                  uVar18 = *(uint *)((long)(local_200->m_backend).data._M_elems + lVar32 * 4);
                  uVar25 = uVar37;
                  if (0 < (int)uVar37) {
                    do {
                      uVar31 = uVar25 - 1;
                      uVar19 = uVar31 >> 1;
                      if ((int)local_290[uVar19] <= (int)uVar18) break;
                      local_290[uVar25] = local_290[uVar19];
                      uVar25 = uVar19;
                    } while (1 < uVar31);
                  }
                  uVar37 = uVar37 + 1;
                  local_290[(int)uVar25] = uVar18;
                }
              }
              pnVar34 = local_280;
              local_2d8.fpclass = cpp_dec_float_finite;
              local_2d8.prec_elem = 10;
              local_2d8.data._M_elems[0] = 0;
              local_2d8.data._M_elems[1] = 0;
              local_2d8.data._M_elems[2] = 0;
              local_2d8.data._M_elems[3] = 0;
              local_2d8.data._M_elems[4] = 0;
              local_2d8.data._M_elems[5] = 0;
              local_2d8.data._M_elems._24_5_ = 0;
              local_2d8.data._M_elems[7]._1_3_ = 0;
              local_2d8.data._M_elems._32_5_ = 0;
              local_2d8.data._M_elems[9]._1_3_ = 0;
              local_2d8.exp = 0;
              local_2d8.neg = false;
              pcVar23 = &local_318;
              if (&local_2d8 != (cpp_dec_float<50U,_int,_void> *)((long)local_2e0 + lVar29 * 0x38))
              {
                local_2d8.data._M_elems._32_5_ =
                     SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
                local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
                local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
                local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
                local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
                local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
                local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
                local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
                local_2d8.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
                local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
                local_2d8.exp = local_318.exp;
                local_2d8.neg = local_318.neg;
                local_2d8.fpclass = local_318.fpclass;
                local_2d8.prec_elem = local_318.prec_elem;
                pcVar23 = (cpp_dec_float<50U,_int,_void> *)((long)local_2e0 + lVar29 * 0x38);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_2d8,pcVar23);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,&local_2d8);
              a = 0.0;
              if (local_188.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_2d8,0,(type *)0x0);
                iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_188,&local_2d8);
                a = 1e-100;
                if (iVar14 != 0) {
                  a = 0.0;
                }
              }
              pnVar36 = pnVar34 + lVar32;
              local_148.fpclass = cpp_dec_float_finite;
              local_148.prec_elem = 10;
              local_148.data._M_elems[0] = 0;
              local_148.data._M_elems[1] = 0;
              local_148.data._M_elems[2] = 0;
              local_148.data._M_elems[3] = 0;
              local_148.data._M_elems[4] = 0;
              local_148.data._M_elems[5] = 0;
              local_148.data._M_elems._24_5_ = 0;
              local_148.data._M_elems[7]._1_3_ = 0;
              local_148.data._M_elems._32_5_ = 0;
              local_148.data._M_elems[9]._1_3_ = 0;
              local_148.exp = 0;
              local_148.neg = false;
              local_2d8.fpclass = cpp_dec_float_finite;
              local_2d8.prec_elem = 10;
              local_2d8.data._M_elems._0_16_ = ZEXT816(0);
              local_2d8.data._M_elems[4] = 0;
              local_2d8.data._M_elems[5] = 0;
              local_2d8.data._M_elems._24_5_ = 0;
              local_2d8.data._M_elems[7]._1_3_ = 0;
              local_2d8.data._M_elems._32_5_ = 0;
              local_2d8.data._M_elems[9]._1_3_ = 0;
              local_2d8.exp = 0;
              local_2d8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_2d8,a);
              auVar10 = (undefined1  [16])local_188.data._M_elems._0_16_;
              local_148.data._M_elems[0] = local_188.data._M_elems[0];
              local_148.data._M_elems[1] = local_188.data._M_elems[1];
              local_148.data._M_elems[2] = local_188.data._M_elems[2];
              local_148.data._M_elems[3] = local_188.data._M_elems[3];
              local_148.data._M_elems[4] = local_188.data._M_elems[4];
              local_148.data._M_elems[5] = local_188.data._M_elems[5];
              local_148.data._M_elems._24_5_ = local_188.data._M_elems._24_5_;
              local_148.data._M_elems[7]._1_3_ = local_188.data._M_elems[7]._1_3_;
              local_148.data._M_elems._32_5_ = local_188.data._M_elems._32_5_;
              local_148.data._M_elems[9]._1_3_ = local_188.data._M_elems[9]._1_3_;
              local_148.exp = local_188.exp;
              local_148.neg = local_188.neg;
              local_148.fpclass = local_188.fpclass;
              local_148.prec_elem = local_188.prec_elem;
              local_188.data._M_elems._0_16_ = auVar10;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_148,&local_2d8);
              *(ulong *)((pnVar36->m_backend).data._M_elems + 8) =
                   CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
              *(undefined8 *)((pnVar36->m_backend).data._M_elems + 4) =
                   local_148.data._M_elems._16_8_;
              *(ulong *)((pnVar36->m_backend).data._M_elems + 6) =
                   CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
              *(undefined8 *)(pnVar36->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
              *(undefined8 *)((pnVar36->m_backend).data._M_elems + 2) =
                   local_148.data._M_elems._8_8_;
              (pnVar36->m_backend).exp = local_148.exp;
              (pnVar36->m_backend).neg = local_148.neg;
              (pnVar36->m_backend).fpclass = local_148.fpclass;
              (pnVar36->m_backend).prec_elem = local_148.prec_elem;
              lVar29 = lVar29 + 1;
            } while (lVar29 < lVar41);
          }
          piVar16 = (int *)((long)local_218 + 1);
          uVar25 = (uint)local_288;
        } while (uVar37 != 0);
        uVar18 = 0;
        uVar39 = local_260;
        pCVar24 = local_298;
        iVar14 = (int)local_1f8;
      }
LAB_00284619:
      pcVar38 = local_2e0;
      iVar22 = (pCVar24->l).firstUnused;
      if (local_190[(long)iVar22 + -1] == (int)piVar16) {
        (pCVar24->l).firstUnused = iVar22 + -1;
      }
      else {
        local_190[iVar22] = (int)piVar16;
      }
      if ((uint)uVar39 != uVar25) {
        local_298->stat = SINGULAR;
        puVar17 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_2d8.data._M_elems._0_8_ = local_2d8.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2d8,"XFORE01 The loaded matrix is singular","");
        *puVar17 = &PTR__SPxException_006a9ee8;
        puVar17[1] = puVar17 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar17 + 1),local_2d8.data._M_elems._0_8_,
                   local_2d8.data._M_elems._0_8_ + local_2d8.data._M_elems._8_8_);
        *puVar17 = &PTR__SPxException_006aa100;
        __cxa_throw(puVar17,&SPxStatusException::typeinfo,SPxException::~SPxException);
      }
      iVar22 = local_208[local_250];
      local_2e0 = (cpp_dec_float<50u,int,void> *)(pnVar34 + iVar22);
      uVar3 = *(undefined8 *)(pnVar34[iVar22].m_backend.data._M_elems + 8);
      local_318.data._M_elems[8] = (uint)uVar3;
      local_318.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)pnVar34[iVar22].m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(pnVar34[iVar22].m_backend.data._M_elems + 2);
      puVar26 = pnVar34[iVar22].m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar26;
      uVar8 = *(undefined8 *)(puVar26 + 2);
      local_318.data._M_elems[4] = (uint)uVar7;
      local_318.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
      local_318.data._M_elems[6] = (uint)uVar8;
      local_318.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
      local_318.data._M_elems[0] = (uint)uVar3;
      local_318.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
      local_318.data._M_elems[2] = (uint)uVar6;
      local_318.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
      local_318.exp = pnVar34[iVar22].m_backend.exp;
      local_318.neg = pnVar34[iVar22].m_backend.neg;
      local_318.fpclass = pnVar34[iVar22].m_backend.fpclass;
      local_318.prec_elem = pnVar34[iVar22].m_backend.prec_elem;
      local_188.fpclass = cpp_dec_float_finite;
      local_188.prec_elem = 10;
      local_188.data._M_elems._0_16_ = ZEXT816(0);
      local_188.data._M_elems[4] = 0;
      local_188.data._M_elems[5] = 0;
      local_188.data._M_elems._24_5_ = 0;
      local_188.data._M_elems[7]._1_3_ = 0;
      local_188.data._M_elems._32_5_ = 0;
      local_188.data._M_elems[9]._1_3_ = 0;
      local_188.exp = 0;
      local_188.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_2d8,1,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_188,&local_2d8,&local_318);
      piVar16 = local_230;
      pCVar24 = local_298;
      pnVar4 = (local_298->diag).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar4[(long)local_230].m_backend.data._M_elems + 0x20) =
           CONCAT35(local_188.data._M_elems[9]._1_3_,local_188.data._M_elems._32_5_);
      puVar26 = (uint *)((long)pnVar4[(long)local_230].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar26 = local_188.data._M_elems._16_8_;
      *(ulong *)(puVar26 + 2) =
           CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
      *(undefined8 *)pnVar4[(long)local_230].m_backend.data._M_elems = local_188.data._M_elems._0_8_
      ;
      *(undefined8 *)((long)pnVar4[(long)local_230].m_backend.data._M_elems + 8) =
           local_188.data._M_elems._8_8_;
      pnVar4[(long)local_230].m_backend.exp = local_188.exp;
      pnVar4[(long)local_230].m_backend.neg = local_188.neg;
      pnVar4[(long)local_230].m_backend.fpclass = local_188.fpclass;
      pnVar4[(long)local_230].m_backend.prec_elem = local_188.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(local_2e0,0.0);
      if (local_198[(long)piVar16] < (int)uVar18) {
        local_268[(long)piVar16] = 0;
        remaxRow(pCVar24,iVar14,uVar18);
        pcVar38 = (cpp_dec_float<50u,int,void> *)
                  (pCVar24->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_278 = (pCVar24->u).row.idx;
      }
      pCVar24->nzCnt = pCVar24->nzCnt + uVar18;
      local_2e0 = (cpp_dec_float<50u,int,void> *)CONCAT44(local_2e0._4_4_,local_238[(long)piVar16]);
      if (0 < (int)uVar18) {
        local_288 = (int *)(ulong)uVar18;
        piVar16 = (int *)0x0;
        do {
          iVar14 = local_208[(int)local_290[(long)piVar16]];
          uVar3 = *(undefined8 *)(pnVar34[iVar14].m_backend.data._M_elems + 8);
          local_318.data._M_elems[8] = (uint)uVar3;
          local_318.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
          uVar3 = *(undefined8 *)pnVar34[iVar14].m_backend.data._M_elems;
          uVar6 = *(undefined8 *)(pnVar34[iVar14].m_backend.data._M_elems + 2);
          puVar26 = pnVar34[iVar14].m_backend.data._M_elems + 4;
          uVar7 = *(undefined8 *)puVar26;
          uVar8 = *(undefined8 *)(puVar26 + 2);
          local_318.data._M_elems[4] = (uint)uVar7;
          local_318.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_318.data._M_elems[6] = (uint)uVar8;
          local_318.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_318.data._M_elems[0] = (uint)uVar3;
          local_318.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
          local_318.data._M_elems[2] = (uint)uVar6;
          local_318.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_318.exp = pnVar34[iVar14].m_backend.exp;
          local_318.neg = pnVar34[iVar14].m_backend.neg;
          local_318.fpclass = pnVar34[iVar14].m_backend.fpclass;
          local_318.prec_elem = pnVar34[iVar14].m_backend.prec_elem;
          if (local_318.fpclass == 2) {
LAB_00284871:
            local_2d8.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]),0);
            local_2d8.data._M_elems[9]._1_3_ = (undefined3)(local_318.data._M_elems[9] >> 8);
            local_2d8.data._M_elems[1] = local_318.data._M_elems[1];
            local_2d8.data._M_elems[0] = local_318.data._M_elems[0];
            local_2d8.data._M_elems[3] = local_318.data._M_elems[3];
            local_2d8.data._M_elems[2] = local_318.data._M_elems[2];
            local_2d8.data._M_elems[5] = local_318.data._M_elems[5];
            local_2d8.data._M_elems[4] = local_318.data._M_elems[4];
            local_2d8.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]),0);
            local_2d8.data._M_elems[7]._1_3_ = (undefined3)(local_318.data._M_elems[7] >> 8);
            local_2d8.exp = local_318.exp;
            local_2d8.neg = local_318.neg;
            local_2d8.fpclass = local_318.fpclass;
            local_2d8.prec_elem = local_318.prec_elem;
            if (((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) &&
               (local_318.data._M_elems[0] != 0 || local_318.fpclass != 0)) {
              local_2d8.neg = false;
            }
            if (((local_318.fpclass != 2) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
               (iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_2d8,&local_1e8), 0 < iVar22)) {
              local_1e8.neg = local_318.neg;
              if ((cpp_dec_float<50u,int,void>)local_318.neg == (cpp_dec_float<50u,int,void>)0x1) {
                local_1e8.neg = local_318.fpclass == 0 && local_318.data._M_elems[0] == 0;
              }
              local_1e8.data._M_elems[0] = local_318.data._M_elems[0];
              local_1e8.data._M_elems[9] = local_318.data._M_elems[9];
              local_1e8.data._M_elems[5] = local_318.data._M_elems[5];
              local_1e8.data._M_elems[6] = local_318.data._M_elems[6];
              local_1e8.data._M_elems[7] = local_318.data._M_elems[7];
              local_1e8.data._M_elems[8] = local_318.data._M_elems[8];
              local_1e8.data._M_elems[1] = local_318.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_318.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_318.data._M_elems[3];
              local_1e8.data._M_elems[4] = local_318.data._M_elems[4];
              local_1e8.exp = local_318.exp;
              local_1e8.fpclass = local_318.fpclass;
              local_1e8.prec_elem = local_318.prec_elem;
            }
            lVar29 = (long)(int)local_2e0;
            local_278[lVar29] = iVar14;
            *(ulong *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems +
                      0x20) = CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
            puVar26 = (uint *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data.
                                     _M_elems + 0x10);
            *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
            *(ulong *)(puVar26 + 2) =
                 CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
            *(ulong *)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems =
                 CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
            *(ulong *)((long)(((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).data._M_elems +
                      8) = CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
            (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).exp = local_318.exp;
            (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).neg = local_318.neg;
            (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).fpclass = local_318.fpclass;
            (((pointer)((long)pcVar38 + lVar29 * 0x38))->m_backend).prec_elem = local_318.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)(pnVar34 + iVar14),0.0);
            pCVar24 = local_298;
            if (local_1a8[iVar14] <= local_228[iVar14]) {
              forestReMaxCol(local_298,iVar14,local_228[iVar14] + 1);
              local_270 = (pCVar24->u).col.idx;
              local_258 = (pCVar24->u).col.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              pnVar34 = local_280;
            }
            local_2e0 = (cpp_dec_float<50u,int,void> *)CONCAT44(local_2e0._4_4_,(int)local_2e0 + 1);
            lVar29 = (long)local_228[iVar14] + (long)local_220[iVar14];
            *(ulong *)((long)local_258[lVar29].m_backend.data._M_elems + 0x20) =
                 CONCAT44(local_318.data._M_elems[9],local_318.data._M_elems[8]);
            puVar26 = (uint *)((long)local_258[lVar29].m_backend.data._M_elems + 0x10);
            *(ulong *)puVar26 = CONCAT44(local_318.data._M_elems[5],local_318.data._M_elems[4]);
            *(ulong *)(puVar26 + 2) =
                 CONCAT44(local_318.data._M_elems[7],local_318.data._M_elems[6]);
            *(ulong *)local_258[lVar29].m_backend.data._M_elems =
                 CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
            *(ulong *)((long)local_258[lVar29].m_backend.data._M_elems + 8) =
                 CONCAT44(local_318.data._M_elems[3],local_318.data._M_elems[2]);
            local_258[lVar29].m_backend.exp = local_318.exp;
            local_258[lVar29].m_backend.neg = local_318.neg;
            local_258[lVar29].m_backend.fpclass = local_318.fpclass;
            local_258[lVar29].m_backend.prec_elem = local_318.prec_elem;
            iVar22 = local_220[iVar14];
            iVar15 = local_228[iVar14];
            local_228[iVar14] = iVar15 + 1;
            local_270[(long)iVar22 + (long)iVar15] = (int)local_1f8;
          }
          else {
            local_2d8.fpclass = cpp_dec_float_finite;
            local_2d8.prec_elem = 10;
            local_2d8.data._M_elems._0_16_ = ZEXT816(0);
            local_2d8.data._M_elems[4] = 0;
            local_2d8.data._M_elems[5] = 0;
            local_2d8.data._M_elems._24_5_ = 0;
            local_2d8.data._M_elems[7]._1_3_ = 0;
            local_2d8.data._M_elems._32_5_ = 0;
            local_2d8.data._M_elems[9]._1_3_ = 0;
            local_2d8.exp = 0;
            local_2d8.neg = false;
            local_218 = piVar16;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2d8,0.0);
            piVar16 = local_218;
            iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_318,&local_2d8);
            if (iVar22 != 0) goto LAB_00284871;
          }
          piVar16 = (int *)((long)piVar16 + 1);
        } while (local_288 != piVar16);
      }
      local_268[(long)local_230] = (int)local_2e0 - local_238[(long)local_230];
    }
  }
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 8) =
       CONCAT44(local_1e8.data._M_elems[9],local_1e8.data._M_elems[8]);
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 4) =
       CONCAT44(local_1e8.data._M_elems[5],local_1e8.data._M_elems[4]);
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 6) =
       CONCAT44(local_1e8.data._M_elems[7],local_1e8.data._M_elems[6]);
  *(ulong *)(local_298->maxabs).m_backend.data._M_elems =
       CONCAT44(local_1e8.data._M_elems[1],local_1e8.data._M_elems[0]);
  *(ulong *)((local_298->maxabs).m_backend.data._M_elems + 2) =
       CONCAT44(local_1e8.data._M_elems[3],local_1e8.data._M_elems[2]);
  (local_298->maxabs).m_backend.exp = local_1e8.exp;
  (local_298->maxabs).m_backend.neg = local_1e8.neg;
  (local_298->maxabs).m_backend.fpclass = local_1e8.fpclass;
  (local_298->maxabs).m_backend.prec_elem = local_1e8.prec_elem;
  local_298->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::forestUpdate(int p_col, R* p_work, int num, int* nonz)
{
   int i, j, k, h, m, n;
   int ll, c, r, rowno;
   R x;

   R* lval;
   int* lidx;
   int* lbeg = l.start;

   R* cval;
   int* cidx = u.col.idx;
   int* cmax = u.col.max;
   int* clen = u.col.len;
   int* cbeg = u.col.start;

   R* rval = u.row.val.data();
   int* ridx = u.row.idx;
   int* rmax = u.row.max;
   int* rlen = u.row.len;
   int* rbeg = u.row.start;

   int* rperm = row.perm;
   int* rorig = row.orig;
   int* cperm = col.perm;
   int* corig = col.orig;

   R l_maxabs = maxabs;
   int dim = thedim;

   /*  Remove column p_col from U
    */
   j = cbeg[p_col];
   i = clen[p_col];
   nzCnt -= i;

   for(i += j - 1; i >= j; --i)
   {
      m = cidx[i];          // remove column p_col from row m
      k = rbeg[m];
      h = --(rlen[m]) + k;    // decrease length of row m

      while(ridx[k] != p_col)
         ++k;

      assert(k <= h);       // k is the position of p_col, h is last position

      ridx[k] = ridx[h];    // store last index at the position of p_col

      rval[k] = rval[h];
   }

   /*  Insert new VectorBase<R> column p_col thereby determining the highest permuted
    *       row index r.
    *
    *       Distinguish between optimized call (num > 0, nonz != 0) and
    *       non-optimized one.
    */
   assert(num);   // otherwise the assert( nonz != 0 ) below should fail

   if(num)
   {
      // Optimized call.
      assert(nonz != nullptr);

      clen[p_col] = 0;

      if(num > cmax[p_col])
         forestReMaxCol(p_col, num);

      cidx = u.col.idx;

      cval = u.col.val.data();

      k = cbeg[p_col];

      r = 0;

      for(j = 0; j < num; ++j)
      {
         i = nonz[j];
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;

            cidx[k++] = i;

            /* insert to row file */
            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);
   }
   else
   {
      // Non-optimized call: We have to access all elements of p_work.
      assert(nonz == nullptr);

      /*
       *      clen[col] = 0;
       *      reMaxCol(fac, col, dim);
       */
      cidx = u.col.idx;
      cval = u.col.val.data();
      k = cbeg[p_col];
      j = k + cmax[p_col];
      r = 0;

      for(i = 0; i < dim; ++i)
      {
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            if(k >= j)
            {
               clen[p_col] = k - cbeg[p_col];
               forestReMaxCol(p_col, dim - i);
               cidx = u.col.idx;
               cval = u.col.val.data();
               k = cbeg[p_col];
               j = k + cmax[p_col];
               k += clen[p_col];
            }

            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;
            cidx[k++] = i;

            /* insert to row file */

            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);

      if(cbeg[p_col] + cmax[p_col] == u.col.used)
      {
         u.col.used -= cmax[p_col];
         cmax[p_col] = clen[p_col];
         u.col.used += cmax[p_col];
      }
   }

   c = cperm[p_col];

   if(r > c)                          /* Forest Tomlin update */
   {
      /*      update permutations
       */
      j = rorig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    rorig[i] = rorig[i + 1];
      memmove(&rorig[c], &rorig[c + 1], (unsigned int)(r - c) * sizeof(int));

      rorig[r] = j;

      for(i = c; i <= r; ++i)
         rperm[rorig[i]] = i;

      j = corig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    corig[i] = corig[i + 1];
      memmove(&corig[c], &corig[c + 1], (unsigned int)(r - c) * sizeof(int));

      corig[r] = j;

      for(i = c; i <= r; ++i)
         cperm[corig[i]] = i;


      rowno = rorig[r];

      j = rbeg[rowno];

      i = rlen[rowno];

      nzCnt -= i;

      if(i < verySparseFactor * (dim - c))      // few nonzeros to be eliminated
      {
         /**
          *          The following assert is obviously violated if this method is called
          *          with nonzero==0.
          *
          *          @todo Use an extra member variable as a buffer for the heap instead of
          *                misusing nonz and num. The method enQueueMin() seems to
          *                sort the nonzeros or something, for which it only needs
          *                some empty VectorBase<R> of size num.
          */
         assert(nonz != nullptr);

         /*  move row r from U to p_work
          */
         num = 0;

         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            enQueueMin(nonz, &num, cperm[k]);
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         assert((num == 0) || (nonz != nullptr));

         /* for(i = c; i < r; ++i)       */
         while(num)
         {
#ifndef NDEBUG
            // The numbers seem to be often 1e-100, is this ok ?

            for(i = 0; i < num; ++i)
               assert(p_work[corig[nonz[i]]] != 0.0);

#endif // NDEBUG
            i = deQueueMin(nonz, &num);

            if(i == r)
               break;

            k = corig[i];

            assert(p_work[k] != 0.0);

            n = rorig[i];

            x = p_work[k] * diag[n];

            lidx[ll] = n;

            lval[ll] = x;

            p_work[k] = 0.0;

            ll++;

            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            j = rbeg[n];

            m = rlen[n] + j;

            for(; j < m; ++j)
            {
               int jj = ridx[j];
               R y = p_work[jj];

               if(y == 0)
                  enQueueMin(nonz, &num, cperm[jj]);

               y -= x * rval[j];

               p_work[jj] = y + ((y == 0) ? SOPLEX_FACTOR_MARKER : 0.0);
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         if(i != r)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE01 The loaded matrix is singular");
         }

         k = corig[r];

         x = p_work[k];
         diag[rowno] = 1 / x;
         p_work[k] = 0.0;


         /*  make row large enough to fit all nonzeros.
          */

         if(rmax[rowno] < num)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, num);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += num;

         /*  Insert work to updated row thereby clearing work;
          */
         n = rbeg[rowno];

         for(i = 0; i < num; ++i)
         {
            j = corig[nonz[i]];
            x = p_work[j];

            // BH 2005-08-24: This if is very important. It may well happen that
            // during the elimination of row r a nonzero elements cancels out
            // and becomes zero. This would lead to an infinite loop in the
            // above elimination code, since the corresponding column index would
            // be enqueued for further elimination again and agian.

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
      else            /* few nonzeros to be eliminated        */
      {
         /*  move row r from U to p_work
          */
         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         for(i = c; i < r; ++i)
         {
            k = corig[i];

            if(p_work[k] != 0.0)
            {
               n = rorig[i];
               x = p_work[k] * diag[n];
               lidx[ll] = n;
               lval[ll] = x;
               p_work[k] = 0.0;
               ll++;

               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               j = rbeg[n];

               m = rlen[n] + j;

               for(; j < m; ++j)
                  p_work[ridx[j]] -= x * rval[j];
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         k = corig[r];

         x = p_work[k];

         if(x == 0.0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE02 The loaded matrix is singular");
            //            return;
         }

         diag[rowno] = 1 / x;

         p_work[k] = 0.0;


         /*  count remaining nonzeros in work and make row large enough
          *  to fit them all.
          */
         n = 0;

         for(i = r + 1; i < dim; ++i)
            if(p_work[corig[i]] != 0.0)
               n++;

         if(rmax[rowno] < n)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, n);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += n;

         /*  Insert p_work to updated row thereby clearing p_work;
          */
         n = rbeg[rowno];

         for(i = r + 1; i < dim; ++i)
         {
            j = corig[i];
            x = p_work[j];

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
   }

   else if(r == c)
   {
      /*  Move diagonal element to diag.  Note, that it must be the last
       *  element, since it has just been inserted above.
       */
      rowno = rorig[r];
      i = rbeg[rowno] + --(rlen[rowno]);
      diag[rowno] = 1 / rval[i];

      for(j = i = --(clen[p_col]) + cbeg[p_col]; cidx[i] != rowno; --i)
         ;

      cidx[i] = cidx[j];

      cval[i] = cval[j];
   }
   else /* r < c */
   {
      this->stat = SLinSolver<R>::SINGULAR;
      throw SPxStatusException("XFORE03 The loaded matrix is singular");
      //      return;
   }

   maxabs = l_maxabs;

   assert(isConsistent());
   this->stat = SLinSolver<R>::OK;
}